

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O1

Vec_Int_t * Gia_ManInsePerform(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int fVerbose)

{
  Vec_Int_t *__ptr;
  int iVar1;
  int iVar2;
  Vec_Int_t *vInit;
  int *piVar3;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  timespec ts;
  int Cost;
  uint local_68;
  timespec local_60;
  uint local_4c;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  long local_38;
  
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  Gia_ManRandomW(1);
  if (fVerbose != 0) {
    printf("Running with %d frames, %d words, and %sgiven init state.\n",(ulong)(uint)nFrames,
           (ulong)(uint)nWords);
  }
  vInit = (Vec_Int_t *)malloc(0x10);
  vInit->nCap = 0;
  vInit->nSize = 0;
  vInit->pArray = (int *)0x0;
  iVar1 = p->nRegs;
  lVar10 = (long)iVar1;
  if (0 < lVar10) {
    piVar3 = (int *)malloc(lVar10 * 4);
    vInit->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vInit->nCap = iVar1;
    if (0 < iVar1) {
      piVar3 = vInit->pArray;
      lVar6 = 0;
      do {
        piVar3[lVar6] = 2;
        lVar6 = lVar6 + 1;
      } while (lVar10 != lVar6);
    }
  }
  vInit->nSize = iVar1;
  iVar8 = (p->vCis->nSize - p->nRegs) * nFrames;
  local_40 = vInit0;
  local_48 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar2 = iVar8;
  }
  local_48->nSize = 0;
  local_48->nCap = iVar2;
  if (iVar2 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar2 << 2);
  }
  local_48->pArray = piVar3;
  local_48->nSize = iVar8;
  uVar9 = 0;
  memset(piVar3,0,(long)iVar8 << 2);
  if (p->pData != (void *)0x0) {
    __assert_fail("!p->pData",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcInse.c"
                  ,0x21,"void Gia_ParTestAlloc(Gia_Man_t *, int)");
  }
  pvVar4 = malloc((long)p->nObjs * (long)nWords * 0x10);
  p->pData = pvVar4;
  p->iData = nWords;
  Gia_ManInseInit(p,vInit);
  pVVar5 = local_40;
  if (0 < iVar1) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + (((uint)vInit->pArray[lVar6] >> 1 & 1) != 0);
      lVar6 = lVar6 + 1;
    } while (lVar10 != lVar6);
  }
  if (fVerbose != 0) {
    printf("Frame =%6d : Values =%6d (out of %6d)\n",0,(ulong)uVar9,(ulong)uVar9);
  }
  if (nFrames < 1) {
    local_68 = 0;
  }
  else {
    iVar1 = 0;
    local_38 = lVar7;
    do {
      iVar2 = clock_gettime(3,&local_60);
      if (iVar2 < 0) {
        lVar7 = 1;
      }
      else {
        lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
        lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_60.tv_sec * -1000000;
      }
      if (0 < p->nObjs) {
        iVar2 = 0;
        do {
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          Gia_ManInseSimulateObj(p,iVar2);
          iVar2 = iVar2 + 1;
        } while (iVar2 < p->nObjs);
      }
      iVar2 = Gia_ManInseHighestScore(p,(int *)&local_4c);
      Gia_ManInseFindStarting(p,iVar2,vInit,local_48);
      Gia_ManInseInit(p,vInit);
      if (fVerbose != 0) {
        printf("Frame =%6d : Values =%6d (out of %6d)   ",(ulong)(iVar1 + 1),(ulong)local_4c,
               (ulong)uVar9);
        iVar8 = 3;
        iVar2 = clock_gettime(3,&local_60);
        if (iVar2 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        Abc_Print(iVar8,"%s =","Time");
        Abc_Print(iVar8,"%9.2f sec\n",SUB84((double)(lVar10 + lVar7) / 1000000.0,0));
      }
      iVar1 = iVar1 + 1;
      lVar7 = local_38;
      pVVar5 = local_40;
      local_68 = nFrames;
    } while (iVar1 != nFrames);
  }
  if (p->pData != (void *)0x0) {
    free(p->pData);
    p->pData = (void *)0x0;
  }
  __ptr = local_48;
  p->iData = 0;
  pVVar5 = Gia_ManInseSimulate(p,pVVar5,local_48,vInit);
  if (vInit->pArray != (int *)0x0) {
    free(vInit->pArray);
    vInit->pArray = (int *)0x0;
  }
  free(vInit);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  printf("After %d frames, found a sequence to produce %d x-values (out of %d).  ",(ulong)local_68,
         (ulong)local_4c,(ulong)(uint)p->nRegs);
  iVar2 = 3;
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar2,"%s =","Total runtime");
  Abc_Print(iVar2,"%9.2f sec\n",SUB84((double)(lVar10 + lVar7) / 1000000.0,0));
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_ManInsePerform( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int fVerbose )
{
    Vec_Int_t * vRes, * vInit, * vInputs;
    Gia_Obj_t * pObj;
    int i, f, iPat, Cost, Cost0;
    abctime clk, clkTotal = Abc_Clock();
    Gia_ManRandomW( 1 );
    if ( fVerbose )
        printf( "Running with %d frames, %d words, and %sgiven init state.\n", nFrames, nWords, vInit0 ? "":"no " );
    vInit = Vec_IntAlloc(0); Vec_IntFill( vInit, Gia_ManRegNum(p), 2 );
    vInputs = Vec_IntStart( Gia_ManPiNum(p) * nFrames );
    Gia_ParTestAlloc( p, nWords );
    Gia_ManInseInit( p, vInit );
    Cost0 = 0;
    Vec_IntForEachEntry( vInit, iPat, i )
        Cost0 += ((iPat >> 1) & 1);
    if ( fVerbose )
        printf( "Frame =%6d : Values =%6d (out of %6d)\n", 0, Cost0, Cost0 );
    for ( f = 0; f < nFrames; f++ )
    {
        clk = Abc_Clock();
        Gia_ManForEachObj( p, pObj, i )
            Gia_ManInseSimulateObj( p, i );
        iPat = Gia_ManInseHighestScore( p, &Cost );
        Gia_ManInseFindStarting( p, iPat, vInit, vInputs );
        Gia_ManInseInit( p, vInit );
        if ( fVerbose )
            printf( "Frame =%6d : Values =%6d (out of %6d)   ", f+1, Cost, Cost0 );
        if ( fVerbose )
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Gia_ParTestFree( p );
    vRes = Gia_ManInseSimulate( p, vInit0, vInputs, vInit );
    Vec_IntFreeP( &vInit );
    Vec_IntFreeP( &vInputs );
    printf( "After %d frames, found a sequence to produce %d x-values (out of %d).  ", f, Cost, Gia_ManRegNum(p) );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return vRes;
}